

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_strifeweapons.cpp
# Opt level: O3

int AF_A_AlertMonsters(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  undefined8 *puVar2;
  PClass *pPVar3;
  int iVar4;
  undefined4 extraout_var;
  PClass *pPVar5;
  uint uVar6;
  AActor *emitter;
  VMValue *pVVar7;
  char *__assertion;
  AActor *target;
  uint uVar8;
  uint uVar9;
  bool bVar10;
  bool bVar11;
  double maxdist;
  
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005f86ba;
  }
  if ((param->field_0).field_3.Type != '\x03') goto LAB_005f86aa;
  emitter = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (emitter == (AActor *)0x0) goto LAB_005f84f5;
    pPVar5 = (emitter->super_DThinker).super_DObject.Class;
    if (pPVar5 == (PClass *)0x0) {
      iVar4 = (**(emitter->super_DThinker).super_DObject._vptr_DObject)(emitter);
      pPVar5 = (PClass *)CONCAT44(extraout_var,iVar4);
      (emitter->super_DThinker).super_DObject.Class = pPVar5;
    }
    bVar10 = pPVar5 == (PClass *)0x0;
    ret = (VMReturn *)(ulong)!bVar10;
    bVar11 = pPVar5 == pPVar3;
    if (!bVar11 && !bVar10) {
      do {
        pPVar5 = pPVar5->ParentClass;
        ret = (VMReturn *)(ulong)(pPVar5 != (PClass *)0x0);
        if (pPVar5 == pPVar3) break;
      } while (pPVar5 != (PClass *)0x0);
    }
    pVVar7 = (VMValue *)(ulong)(bVar11 || bVar10);
    uVar6 = (uint)bVar10;
    if ((char)ret == '\0') {
      __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_005f86ba;
    }
  }
  else {
    if (emitter != (AActor *)0x0) goto LAB_005f86aa;
LAB_005f84f5:
    emitter = (AActor *)0x0;
    pVVar7 = param;
    uVar6 = numparam;
  }
  pPVar3 = AActor::RegistrationInfo.MyClass;
  uVar8 = 0;
  maxdist = 0.0;
  uVar9 = 0;
  if (numparam == 1) goto LAB_005f863c;
  VVar1 = param[1].field_0.field_3.Type;
  if (VVar1 != 0xff) {
    if (VVar1 != '\x03') {
LAB_005f86aa:
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
      ;
      goto LAB_005f86ba;
    }
    puVar2 = (undefined8 *)param[1].field_0.field_1.a;
    if (param[1].field_0.field_1.atag == 1) {
      if (puVar2 != (undefined8 *)0x0) {
        pPVar5 = (PClass *)puVar2[1];
        if (pPVar5 == (PClass *)0x0) {
          pPVar5 = (PClass *)(**(code **)*puVar2)(puVar2,pVVar7,uVar6,ret);
          puVar2[1] = pPVar5;
        }
        bVar10 = pPVar5 != (PClass *)0x0;
        if (pPVar5 != pPVar3 && bVar10) {
          do {
            pPVar5 = pPVar5->ParentClass;
            bVar10 = pPVar5 != (PClass *)0x0;
            if (pPVar5 == pPVar3) break;
          } while (pPVar5 != (PClass *)0x0);
        }
        if (!bVar10) {
          __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_005f86ba;
        }
      }
    }
    else if (puVar2 != (undefined8 *)0x0) goto LAB_005f86aa;
  }
  maxdist = 0.0;
  uVar9 = uVar8;
  if (2 < numparam) {
    VVar1 = param[2].field_0.field_3.Type;
    if ((VVar1 != 0xff) &&
       ((VVar1 != '\x03' ||
        ((param[2].field_0.field_1.atag != 8 && (param[2].field_0.field_1.a != (void *)0x0)))))) {
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
LAB_005f86ba:
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_strifeweapons.cpp"
                    ,0x95,"int AF_A_AlertMonsters(VMFrameStack *, VMValue *, int, VMReturn *, int)")
      ;
    }
    if (numparam != 3) {
      VVar1 = param[3].field_0.field_3.Type;
      if (VVar1 == '\x01') {
        maxdist = param[3].field_0.f;
      }
      else {
        maxdist = 0.0;
        if (VVar1 != 0xff) {
          __assert_fail("param[paramnum].Type == REGT_FLOAT",
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_strifeweapons.cpp"
                        ,0x96,
                        "int AF_A_AlertMonsters(VMFrameStack *, VMValue *, int, VMReturn *, int)");
        }
      }
      if (4 < (uint)numparam) {
        VVar1 = param[4].field_0.field_3.Type;
        if (VVar1 == '\0') {
          uVar9 = param[4].field_0.i;
        }
        else if (VVar1 != 0xff) {
          __assert_fail("param[paramnum].Type == REGT_INT",
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_strifeweapons.cpp"
                        ,0x97,
                        "int AF_A_AlertMonsters(VMFrameStack *, VMValue *, int, VMReturn *, int)");
        }
      }
    }
  }
LAB_005f863c:
  target = emitter;
  if ((uVar9 & 1) == 0 && emitter->player == (player_t *)0x0) {
    target = (emitter->target).field_0.p;
    if (target == (AActor *)0x0) {
      return 0;
    }
    if (((target->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
      (emitter->target).field_0.p = (AActor *)0x0;
      return 0;
    }
    if (((uVar9 & 2) == 0) && (target->player == (player_t *)0x0)) {
      return 0;
    }
  }
  if ((uVar9 & 4) != 0) {
    emitter = target;
  }
  P_NoiseAlert(target,emitter,false,maxdist);
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION_PARAMS(AActor, A_AlertMonsters)
{
	PARAM_ACTION_PROLOGUE;
	PARAM_FLOAT_OPT(maxdist) { maxdist = 0; }
	PARAM_INT_OPT(Flags) { Flags = 0; }

	AActor * target = NULL;
	AActor * emitter = self;

	if (self->player != NULL || (Flags & AMF_TARGETEMITTER))
	{
		target = self;
	}
	else if (self->target != NULL && (Flags & AMF_TARGETNONPLAYER))
	{
		target = self->target;
	}
	else if (self->target != NULL && self->target->player != NULL)
	{
		target = self->target;
	}

	if (Flags & AMF_EMITFROMTARGET) emitter = target;

	if (target != NULL && emitter != NULL)
	{
		P_NoiseAlert(target, emitter, false, maxdist);
	}
	return 0;
}